

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O0

void Omega_h::transfer_inherit_refine
               (Mesh *old_mesh,Mesh *new_mesh,LOs *keys2edges,Int prod_dim,LOs *keys2prods,
               LOs *prods2new_ents,LOs *same_ents2old_ents,LOs *same_ents2new_ents,TagBase *tagbase)

{
  Int IVar1;
  LOs *new_mesh_00;
  Mesh *old_mesh_00;
  int iVar2;
  string *psVar3;
  Read<int> local_188;
  Read<int> local_178;
  Read<int> local_168;
  Read<int> local_158;
  Read<int> local_148;
  Read<int> local_138;
  Read<int> local_128;
  Read<int> local_118;
  Read<int> local_108;
  Read<int> local_f8;
  Read<int> local_e8;
  Read<int> local_d8;
  Read<int> local_c8;
  Read<int> local_b8;
  Read<int> local_a8;
  Read<int> local_98;
  Read<int> local_88;
  Read<int> local_78 [2];
  Read<int> local_58;
  Read<int> local_48;
  LOs *local_38;
  LOs *prods2new_ents_local;
  LOs *keys2prods_local;
  LOs *pLStack_20;
  Int prod_dim_local;
  LOs *keys2edges_local;
  Mesh *new_mesh_local;
  Mesh *old_mesh_local;
  
  local_38 = prods2new_ents;
  prods2new_ents_local = keys2prods;
  keys2prods_local._4_4_ = prod_dim;
  pLStack_20 = keys2edges;
  keys2edges_local = (LOs *)new_mesh;
  new_mesh_local = old_mesh;
  iVar2 = (*tagbase->_vptr_TagBase[2])();
  old_mesh_00 = new_mesh_local;
  new_mesh_00 = keys2edges_local;
  switch(iVar2) {
  case 0:
    Read<int>::Read(&local_48,keys2edges);
    IVar1 = keys2prods_local._4_4_;
    Read<int>::Read(&local_58,keys2prods);
    Read<int>::Read(local_78,prods2new_ents);
    Read<int>::Read(&local_88,same_ents2old_ents);
    Read<int>::Read(&local_98,same_ents2new_ents);
    psVar3 = TagBase::name_abi_cxx11_(tagbase);
    transfer_inherit_refine<signed_char>
              (old_mesh_00,(Mesh *)new_mesh_00,&local_48,IVar1,&local_58,local_78,&local_88,
               &local_98,psVar3);
    Read<int>::~Read(&local_98);
    Read<int>::~Read(&local_88);
    Read<int>::~Read(local_78);
    Read<int>::~Read(&local_58);
    Read<int>::~Read(&local_48);
    break;
  case 2:
    Read<int>::Read(&local_a8,keys2edges);
    IVar1 = keys2prods_local._4_4_;
    Read<int>::Read(&local_b8,keys2prods);
    Read<int>::Read(&local_c8,prods2new_ents);
    Read<int>::Read(&local_d8,same_ents2old_ents);
    Read<int>::Read(&local_e8,same_ents2new_ents);
    psVar3 = TagBase::name_abi_cxx11_(tagbase);
    transfer_inherit_refine<int>
              (old_mesh_00,(Mesh *)new_mesh_00,&local_a8,IVar1,&local_b8,&local_c8,&local_d8,
               &local_e8,psVar3);
    Read<int>::~Read(&local_e8);
    Read<int>::~Read(&local_d8);
    Read<int>::~Read(&local_c8);
    Read<int>::~Read(&local_b8);
    Read<int>::~Read(&local_a8);
    break;
  case 3:
    Read<int>::Read(&local_f8,keys2edges);
    IVar1 = keys2prods_local._4_4_;
    Read<int>::Read(&local_108,keys2prods);
    Read<int>::Read(&local_118,prods2new_ents);
    Read<int>::Read(&local_128,same_ents2old_ents);
    Read<int>::Read(&local_138,same_ents2new_ents);
    psVar3 = TagBase::name_abi_cxx11_(tagbase);
    transfer_inherit_refine<long>
              (old_mesh_00,(Mesh *)new_mesh_00,&local_f8,IVar1,&local_108,&local_118,&local_128,
               &local_138,psVar3);
    Read<int>::~Read(&local_138);
    Read<int>::~Read(&local_128);
    Read<int>::~Read(&local_118);
    Read<int>::~Read(&local_108);
    Read<int>::~Read(&local_f8);
    break;
  case 5:
    Read<int>::Read(&local_148,keys2edges);
    IVar1 = keys2prods_local._4_4_;
    Read<int>::Read(&local_158,keys2prods);
    Read<int>::Read(&local_168,prods2new_ents);
    Read<int>::Read(&local_178,same_ents2old_ents);
    Read<int>::Read(&local_188,same_ents2new_ents);
    psVar3 = TagBase::name_abi_cxx11_(tagbase);
    transfer_inherit_refine<double>
              (old_mesh_00,(Mesh *)new_mesh_00,&local_148,IVar1,&local_158,&local_168,&local_178,
               &local_188,psVar3);
    Read<int>::~Read(&local_188);
    Read<int>::~Read(&local_178);
    Read<int>::~Read(&local_168);
    Read<int>::~Read(&local_158);
    Read<int>::~Read(&local_148);
  }
  return;
}

Assistant:

void transfer_inherit_refine(Mesh* old_mesh, Mesh* new_mesh, LOs keys2edges,
    Int prod_dim, LOs keys2prods, LOs prods2new_ents, LOs same_ents2old_ents,
    LOs same_ents2new_ents, TagBase const* tagbase) {
  switch (tagbase->type()) {
    case OMEGA_H_I8:
      transfer_inherit_refine<I8>(old_mesh, new_mesh, keys2edges, prod_dim,
          keys2prods, prods2new_ents, same_ents2old_ents, same_ents2new_ents,
          tagbase->name());
      break;
    case OMEGA_H_I32:
      transfer_inherit_refine<I32>(old_mesh, new_mesh, keys2edges, prod_dim,
          keys2prods, prods2new_ents, same_ents2old_ents, same_ents2new_ents,
          tagbase->name());
      break;
    case OMEGA_H_I64:
      transfer_inherit_refine<I64>(old_mesh, new_mesh, keys2edges, prod_dim,
          keys2prods, prods2new_ents, same_ents2old_ents, same_ents2new_ents,
          tagbase->name());
      break;
    case OMEGA_H_F64:
      transfer_inherit_refine<Real>(old_mesh, new_mesh, keys2edges, prod_dim,
          keys2prods, prods2new_ents, same_ents2old_ents, same_ents2new_ents,
          tagbase->name());
      break;
  }
}